

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O2

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_stock_directory *m)

{
  ushort uVar1;
  uint6 uVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  __hashtable *__h;
  ulong uVar5;
  ulong uVar6;
  string sym;
  order_book ob;
  key_type local_228;
  string local_208;
  order_book local_1e8;
  pair<const_unsigned_long,_helix::order_book> local_108;
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,m->Stock,&m->MarketCategory);
  sVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->_symbols,&local_228);
  if (sVar3 != 0) {
    std::__cxx11::string::string((string *)&local_208,(string *)&local_228);
    uVar1 = *(ushort *)&m->field_0x9;
    uVar2 = *(uint6 *)&m->field_0x5;
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->_symbol_max_orders,&local_228);
    uVar5 = (ulong)uVar1 << 0x20;
    uVar6 = (ulong)uVar2;
    order_book::order_book
              (&local_1e8,&local_208,
               ((uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
               uVar6 << 0x38) >> 0x10,*pmVar4);
    std::__cxx11::string::~string((string *)&local_208);
    std::pair<const_unsigned_long,_helix::order_book>::
    pair<const_unsigned_short_&,_helix::order_book,_true>(&local_108,&m->StockLocate,&local_1e8);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book>,std::allocator<std::pair<unsigned_long_const,helix::order_book>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,helix::order_book>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,helix::order_book>,std::allocator<std::pair<unsigned_long_const,helix::order_book>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->order_book_id_map,&local_108);
    order_book::~order_book(&local_108.second);
    order_book::~order_book(&local_1e8);
  }
  std::__cxx11::string::~string((string *)&local_228);
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_stock_directory* m)
{
    std::string sym{m->Stock, ITCH_SYMBOL_LEN};
    if (_symbols.count(sym) > 0) {
        order_book ob{sym, itch50_timestamp(m->Timestamp), _symbol_max_orders.at(sym)};
        order_book_id_map.insert({m->StockLocate, std::move(ob)});
    }
}